

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
testing::internal::ComparisonBase::operator_cast_to_Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          ComparisonBase *this)

{
  Impl<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ComparisonBase<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::AnyEq>
  *this_local;
  
  this_00 = (Impl<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  ComparisonBase<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::AnyEq>
  ::
  Impl<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Impl(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
             this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Lhs>() const {
    return Matcher<Lhs>(new Impl<const Lhs&>(rhs_));
  }